

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O3

void __thiscall cmLocalUnixMakefileGenerator3::Generate(cmLocalUnixMakefileGenerator3 *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *pcVar2;
  pointer ppcVar3;
  cmGlobalUnixMakefileGenerator3 *this_00;
  cmGeneratorTarget *this_01;
  bool bVar4;
  TargetType TVar5;
  cmMakefileTargetGenerator *tg;
  pointer ppcVar6;
  string local_48;
  
  bVar4 = cmake::GetIsInTryCompile
                    (((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
                     CMakeInstance);
  if (!bVar4) {
    pcVar2 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"CMAKE_COLOR_MAKEFILE","");
    bVar4 = cmMakefile::IsOn(pcVar2,&local_48);
    this->ColorMakefile = bVar4;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  pcVar2 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  paVar1 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"CMAKE_SKIP_PREPROCESSED_SOURCE_RULES","");
  bVar4 = cmMakefile::IsOn(pcVar2,&local_48);
  this->SkipPreprocessedSourceRules = bVar4;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  pcVar2 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"CMAKE_SKIP_ASSEMBLY_SOURCE_RULES","");
  bVar4 = cmMakefile::IsOn(pcVar2,&local_48);
  this->SkipAssemblySourceRules = bVar4;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  ppcVar6 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GeneratorTargets.
            super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppcVar3 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GeneratorTargets.
            super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppcVar6 != ppcVar3) {
    this_00 = (cmGlobalUnixMakefileGenerator3 *)
              (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator;
    do {
      this_01 = *ppcVar6;
      TVar5 = cmGeneratorTarget::GetType(this_01);
      if (TVar5 != INTERFACE_LIBRARY) {
        tg = cmMakefileTargetGenerator::New(this_01);
        if (tg != (cmMakefileTargetGenerator *)0x0) {
          (*(tg->super_cmCommonTargetGenerator)._vptr_cmCommonTargetGenerator[3])(tg);
          cmGlobalUnixMakefileGenerator3::RecordTargetProgress(this_00,tg);
          (*(tg->super_cmCommonTargetGenerator)._vptr_cmCommonTargetGenerator[1])(tg);
        }
      }
      ppcVar6 = ppcVar6 + 1;
    } while (ppcVar6 != ppcVar3);
  }
  WriteLocalMakefile(this);
  WriteDirectoryInformationFile(this);
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::Generate()
{
  // Record whether some options are enabled to avoid checking many
  // times later.
  if (!this->GetGlobalGenerator()->GetCMakeInstance()->GetIsInTryCompile()) {
    this->ColorMakefile = this->Makefile->IsOn("CMAKE_COLOR_MAKEFILE");
  }
  this->SkipPreprocessedSourceRules =
    this->Makefile->IsOn("CMAKE_SKIP_PREPROCESSED_SOURCE_RULES");
  this->SkipAssemblySourceRules =
    this->Makefile->IsOn("CMAKE_SKIP_ASSEMBLY_SOURCE_RULES");

  // Generate the rule files for each target.
  const std::vector<cmGeneratorTarget*>& targets = this->GetGeneratorTargets();
  cmGlobalUnixMakefileGenerator3* gg =
    static_cast<cmGlobalUnixMakefileGenerator3*>(this->GlobalGenerator);
  for (cmGeneratorTarget* target : targets) {
    if (target->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
      continue;
    }
    std::unique_ptr<cmMakefileTargetGenerator> tg(
      cmMakefileTargetGenerator::New(target));
    if (tg) {
      tg->WriteRuleFiles();
      gg->RecordTargetProgress(tg.get());
    }
  }

  // write the local Makefile
  this->WriteLocalMakefile();

  // Write the cmake file with information for this directory.
  this->WriteDirectoryInformationFile();
}